

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

char * conc(vector<char> *buf,tagval *v,int n,bool space,char *prefix,int prefixlen)

{
  size_t sVar1;
  uint n_00;
  ulong uVar2;
  char *__s;
  ulong uVar3;
  char local_37;
  char local_36;
  char local_35 [5];
  
  if ((prefix != (char *)0x0) && (vector<char>::put(buf,prefix,prefixlen), space && n != 0)) {
    vector<char>::add(buf,local_35);
  }
  uVar2 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 * 0x10 != uVar2; uVar2 = uVar2 + 0x10) {
    __s = "";
    switch(*(undefined4 *)((long)&v->type + uVar2)) {
    case 1:
      __s = intstr(*(int *)((long)&(v->super_identval).field_0 + uVar2));
      break;
    case 2:
      __s = floatstr(*(float *)((long)&(v->super_identval).field_0 + uVar2));
      break;
    case 3:
      __s = *(char **)((long)&(v->super_identval).field_0 + uVar2);
      break;
    case 6:
      __s = *(char **)((long)&(v->super_identval).field_0 + uVar2);
      n_00 = *(uint *)(__s + -4) >> 8;
      goto LAB_0012afb8;
    }
    sVar1 = strlen(__s);
    n_00 = (uint)sVar1;
LAB_0012afb8:
    vector<char>::put(buf,__s,n_00);
    if ((ulong)(n - 1) << 4 == uVar2) break;
    if (space) {
      vector<char>::add(buf,&local_37);
    }
  }
  vector<char>::add(buf,&local_36);
  return buf->buf;
}

Assistant:

static char *conc(vector<char> &buf, tagval *v, int n, bool space, const char *prefix = NULL, int prefixlen = 0)
{
    if(prefix)
    {
        buf.put(prefix, prefixlen);
        if(space && n) buf.add(' ');
    }
    loopi(n)
    {
        const char *s = "";
        int len = 0;
        switch(v[i].type)
        {
            case VAL_INT: s = intstr(v[i].i); break;
            case VAL_FLOAT: s = floatstr(v[i].f); break;
            case VAL_STR: s = v[i].s; break;
            case VAL_MACRO: s = v[i].s; len = v[i].code[-1]>>8; goto haslen;
        }
        len = int(strlen(s));
    haslen:
        buf.put(s, len);
        if(i == n-1) break;
        if(space) buf.add(' ');
    }
    buf.add('\0');
    return buf.getbuf();
}